

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

double __thiscall chrono::robosimian::RS_Limb::GetMotorTorque(RS_Limb *this,string *motor_name)

{
  bool bVar1;
  ostream *poVar2;
  pointer pvVar3;
  element_type *peVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
  local_28;
  const_iterator itr;
  string *motor_name_local;
  RS_Limb *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
               )motor_name;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
       ::find(&this->m_motors,motor_name);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
       ::end(&this->m_motors);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Limb::GetMotorTorque -- Unknown motor ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    itr.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
                                    ._M_cur);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (RS_Limb *)0x0;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_false,_true>
                           *)&local_28);
    peVar4 = std::
             __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pvVar3->second);
    this_local = (RS_Limb *)(**(code **)(*(long *)peVar4 + 0x280))();
  }
  return (double)this_local;
}

Assistant:

double RS_Limb::GetMotorTorque(const std::string& motor_name) const {
    auto itr = m_motors.find(motor_name);
    if (itr == m_motors.end()) {
        std::cout << "Limb::GetMotorTorque -- Unknown motor " << motor_name << std::endl;
        return 0;
    }

    return itr->second->GetMotorTorque();
}